

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O1

unsigned_long_long *
meshopt::hashLookup<unsigned_long_long,meshopt::EdgeHasher>
          (unsigned_long_long *table,size_t buckets,EdgeHasher *hash,unsigned_long_long *key,
          unsigned_long_long *empty)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  ulong *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar7 = buckets - 1;
  puVar2 = hash->remap;
  uVar1 = puVar2[*key & 0xffffffff];
  uVar5 = (uVar1 >> 0x12 ^ puVar2[*key >> 0x20]) * 0x5bd1e995;
  uVar8 = (uVar5 >> 0x16 ^ uVar1) * 0x5bd1e995;
  uVar8 = (uVar8 >> 0x11 ^ uVar5) * 0x5bd1e995 >> 0x13 ^ uVar8;
  puVar6 = (ulong *)(ulong)uVar8;
  uVar9 = (ulong)(uVar8 * 0x5bd1e995 & (uint)uVar7);
  uVar10 = 0;
  while( true ) {
    uVar3 = table[uVar9];
    if ((uVar3 == *empty) ||
       ((puVar2[uVar3 >> 0x20] == puVar2[*key >> 0x20] && (puVar2[uVar3 & 0xffffffff] == uVar1)))) {
      bVar4 = false;
      puVar6 = table + uVar9;
    }
    else {
      uVar9 = uVar9 + uVar10 + 1 & uVar7;
      bVar4 = true;
    }
    if (!bVar4) break;
    uVar10 = uVar10 + 1;
    if (uVar7 < uVar10) {
      return (unsigned_long_long *)0x0;
    }
  }
  return puVar6;
}

Assistant:

static T* hashLookup(T* table, size_t buckets, const Hash& hash, const T& key, const T& empty)
{
	assert(buckets > 0);
	assert((buckets & (buckets - 1)) == 0);

	size_t hashmod = buckets - 1;
	size_t bucket = hash.hash(key) & hashmod;

	for (size_t probe = 0; probe <= hashmod; ++probe)
	{
		T& item = table[bucket];

		if (item == empty)
			return &item;

		if (hash.equal(item, key))
			return &item;

		// hash collision, quadratic probing
		bucket = (bucket + probe + 1) & hashmod;
	}

	assert(false && "Hash table is full"); // unreachable
	return 0;
}